

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Length(VirtualMachine *this)

{
  size_type val;
  int64_t val_00;
  Variable VVar1;
  allocator<char> local_41;
  string local_40;
  VariableType local_20;
  Variable top;
  VirtualMachine *this_local;
  
  top.field_1 = (anon_union_8_6_52c89740_for_Variable_1)this;
  VVar1 = popOpStack(this);
  top._0_8_ = VVar1.field_1;
  local_20 = VVar1.type;
  switch(local_20) {
  case Undefined:
    pushUndefined(this);
    break;
  case Integer:
    pushUndefined(this);
    break;
  case Boolean:
    pushUndefined(this);
    break;
  case Float:
    pushUndefined(this);
    break;
  case String:
    val_00 = std::__cxx11::string::size();
    pushInteger(this,val_00);
    break;
  case Object:
    val = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>_>
          ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>_>
                  *)top._0_8_);
    pushInteger(this,val);
    break;
  case Function:
    pushUndefined(this);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unknown varible type at variableEquals",&local_41);
    panic(this,&local_40);
  }
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::Length() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushUndefined();
      break;
    }
    case VariableType::Float: {
      this->pushUndefined();
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushInteger(top.objectValue->properties.size());
      break;
    }
    case VariableType::String: {
      this->pushInteger(top.stringValue->size());
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}